

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

void __thiscall luna::Function::Accept(Function *this,GCObjectVisitor *v)

{
  String *pSVar1;
  Function *pFVar2;
  pointer pVVar3;
  pointer pLVar4;
  pointer ppFVar5;
  pointer pUVar6;
  int iVar7;
  Value *value;
  pointer this_00;
  pointer pLVar8;
  pointer ppFVar9;
  pointer pUVar10;
  
  iVar7 = (*v->_vptr_GCObjectVisitor[1])(v,this);
  if ((char)iVar7 != '\0') {
    pSVar1 = this->module_;
    if (pSVar1 != (String *)0x0) {
      (*(pSVar1->super_GCObject)._vptr_GCObject[2])(pSVar1,v);
    }
    pFVar2 = this->superior_;
    if (pFVar2 != (Function *)0x0) {
      (*(pFVar2->super_GCObject)._vptr_GCObject[2])(pFVar2,v);
    }
    pVVar3 = (this->const_values_).super__Vector_base<luna::Value,_std::allocator<luna::Value>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->const_values_).
                   super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pVVar3; this_00 = this_00 + 1) {
      Value::Accept(this_00,v);
    }
    pLVar4 = (this->local_vars_).
             super__Vector_base<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pLVar8 = (this->local_vars_).
                  super__Vector_base<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start; pLVar8 != pLVar4; pLVar8 = pLVar8 + 1)
    {
      (*(pLVar8->name_->super_GCObject)._vptr_GCObject[2])(pLVar8->name_,v);
    }
    ppFVar5 = (this->child_funcs_).
              super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppFVar9 = (this->child_funcs_).
                   super__Vector_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppFVar9 != ppFVar5; ppFVar9 = ppFVar9 + 1) {
      (*((*ppFVar9)->super_GCObject)._vptr_GCObject[2])(*ppFVar9,v);
    }
    pUVar6 = (this->upvalues_).
             super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pUVar10 = (this->upvalues_).
                   super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start; pUVar10 != pUVar6;
        pUVar10 = pUVar10 + 1) {
      (*(pUVar10->name_->super_GCObject)._vptr_GCObject[2])(pUVar10->name_,v);
    }
  }
  return;
}

Assistant:

void Function::Accept(GCObjectVisitor *v)
    {
        if (v->Visit(this))
        {
            if (module_)
                module_->Accept(v);
            if (superior_)
                superior_->Accept(v);

            for (const auto &value : const_values_)
                value.Accept(v);

            for (const auto &var : local_vars_)
                var.name_->Accept(v);

            for (auto child : child_funcs_)
                child->Accept(v);

            for (const auto &upvalue : upvalues_)
                upvalue.name_->Accept(v);
        }
    }